

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

void __thiscall MidiOutApi::~MidiOutApi(MidiOutApi *this)

{
  (this->super_MidiApi)._vptr_MidiApi = (_func_int **)&PTR__MidiOutApi_00115a88;
  std::__cxx11::string::~string((string *)&(this->super_MidiApi).errorString_);
  return;
}

Assistant:

MidiApi :: ~MidiApi( void )
{
}